

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

CAmount wallet::coinselector_tests::make_hard_case
                  (int utxos,vector<wallet::COutput,_std::allocator<wallet::COutput>_> *utxo_pool)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  long local_58;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::clear(utxo_pool);
  uVar4 = 0;
  iVar1 = 0;
  if (0 < utxos) {
    iVar1 = utxos;
  }
  iVar2 = utxos + -1;
  local_58 = 0;
  for (; (uint)(iVar1 * 2) != uVar4; uVar4 = uVar4 + 2) {
    lVar3 = 1L << ((byte)utxos & 0x3f);
    local_58 = local_58 + lVar3;
    local_40 = lVar3;
    add_coin(&local_40,(int)uVar4,utxo_pool);
    local_40 = (1L << ((byte)iVar2 & 0x3f)) + lVar3;
    add_coin(&local_40,(int)uVar4 + 1,utxo_pool);
    iVar2 = iVar2 + -1;
    utxos = utxos + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_58;
  }
  __stack_chk_fail();
}

Assistant:

static CAmount make_hard_case(int utxos, std::vector<COutput>& utxo_pool)
{
    utxo_pool.clear();
    CAmount target = 0;
    for (int i = 0; i < utxos; ++i) {
        target += CAmount{1} << (utxos+i);
        add_coin(CAmount{1} << (utxos+i), 2*i, utxo_pool);
        add_coin((CAmount{1} << (utxos+i)) + (CAmount{1} << (utxos-1-i)), 2*i + 1, utxo_pool);
    }
    return target;
}